

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void featurePad(pBox *pbox,pBox *outpBox,int pad,int padw,int padh)

{
  int iVar1;
  mydataFmt *pmVar2;
  int iVar3;
  mydataFmt *__src;
  
  pmVar2 = outpBox->pdata;
  __src = pbox->pdata;
  iVar3 = outpBox->height;
  iVar1 = outpBox->channel * iVar3;
  if (pad == -1) {
    if (0 < iVar1) {
      iVar1 = 0;
      do {
        if ((iVar1 % iVar3 < padh) || (iVar3 + ~padh < iVar1 % iVar3)) {
          pmVar2 = pmVar2 + outpBox->width;
        }
        else {
          memcpy(pmVar2 + padw,__src,(long)pbox->width << 2);
          pmVar2 = pmVar2 + padw + (long)pbox->width + (long)padw;
          __src = __src + pbox->width;
        }
        iVar1 = iVar1 + 1;
        iVar3 = outpBox->height;
      } while (iVar1 < outpBox->channel * iVar3);
    }
  }
  else if (0 < iVar1) {
    iVar1 = 0;
    do {
      if ((iVar1 % iVar3 < pad) || (iVar3 + ~pad < iVar1 % iVar3)) {
        pmVar2 = pmVar2 + outpBox->width;
      }
      else {
        memcpy(pmVar2 + pad,__src,(long)pbox->width << 2);
        pmVar2 = pmVar2 + pad + (long)pbox->width + (long)pad;
        __src = __src + pbox->width;
      }
      iVar1 = iVar1 + 1;
      iVar3 = outpBox->height;
    } while (iVar1 < outpBox->channel * iVar3);
  }
  return;
}

Assistant:

void featurePad(const pBox *pbox, pBox *outpBox, const int pad, const int padw, const int padh) {
    mydataFmt *p = outpBox->pdata;
    mydataFmt *pIn = pbox->pdata;
    if (pad == -1) {
        for (int row = 0; row < outpBox->channel * outpBox->height; row++) {
            if ((row % outpBox->height) < padh || (row % outpBox->height > (outpBox->height - padh - 1))) {
                p += outpBox->width;
                continue;
            }
            p += padw;
            memcpy(p, pIn, pbox->width * sizeof(mydataFmt));
            p += pbox->width + padw;
            pIn += pbox->width;
        }
    } else {
        for (int row = 0; row < outpBox->channel * outpBox->height; row++) {
            if ((row % outpBox->height) < pad || (row % outpBox->height > (outpBox->height - pad - 1))) {
                p += outpBox->width;
                continue;
            }
            p += pad;
            memcpy(p, pIn, pbox->width * sizeof(mydataFmt));
            p += pbox->width + pad;
            pIn += pbox->width;
        }
    }
}